

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::JoinDefines
          (cmLocalGenerator *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *defines,string *definesString,string *lang)

{
  _Rb_tree_node_base *p_Var1;
  cmMakefile *this_00;
  _Base_ptr p_Var2;
  string *psVar3;
  bool bVar4;
  cmValue cVar5;
  long lVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  char cVar9;
  char *pcVar10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view str;
  string local_e8;
  cmLocalGenerator *local_c8;
  string dflag;
  long *local_a0;
  size_t local_98;
  long local_90 [2];
  cmOutputConverter *local_80;
  string *local_78;
  _Rb_tree_node_base *local_70;
  char *local_68;
  string def;
  
  dflag._M_dataplus._M_p = (pointer)&dflag.field_2;
  local_c8 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dflag,"-D","");
  if (lang->_M_string_length != 0) {
    this_00 = local_c8->Makefile;
    def.field_2._8_8_ = (lang->_M_dataplus)._M_p;
    def._M_dataplus._M_p = (pointer)0x6;
    def._M_string_length = (long)"The CMAKE_" + 4;
    views._M_len = 3;
    views._M_array = (iterator)&def;
    def.field_2._M_allocated_capacity = lang->_M_string_length;
    cmCatViews_abi_cxx11_(&local_e8,views);
    cVar5 = cmMakefile::GetDefinition(this_00,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((cVar5.Value != (string *)0x0) && ((cVar5.Value)->_M_string_length != 0)) {
      std::__cxx11::string::_M_assign((string *)&dflag);
    }
  }
  p_Var7 = (defines->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_70 = &(defines->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var7 != local_70) {
    pcVar10 = "";
    if (definesString->_M_string_length != 0) {
      pcVar10 = " ";
    }
    local_80 = &local_c8->super_cmOutputConverter;
    local_78 = definesString;
    do {
      def._M_dataplus._M_p = (pointer)&def.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&def,dflag._M_dataplus._M_p,
                 dflag._M_dataplus._M_p + dflag._M_string_length);
      local_68 = pcVar10;
      bVar4 = cmState::UseWatcomWMake
                        ((local_c8->GlobalGenerator->CMakeInstance->State)._M_t.
                         super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                         super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                         super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
      if (bVar4) {
        p_Var2 = p_Var7[1]._M_parent;
        if (p_Var2 != (_Base_ptr)0x0) {
          lVar6 = *(long *)(p_Var7 + 1);
          p_Var8 = (_Base_ptr)0x0;
          do {
            cVar9 = (char)&def;
            if ((byte)(*(char *)((long)&p_Var8->_M_color + lVar6) - 0x23U) < 2) {
              std::__cxx11::string::push_back(cVar9);
            }
            std::__cxx11::string::push_back(cVar9);
            p_Var8 = (_Base_ptr)((long)&p_Var8->_M_color + 1);
          } while (p_Var2 != p_Var8);
        }
      }
      else {
        p_Var1 = p_Var7 + 1;
        lVar6 = std::__cxx11::string::find((char)p_Var1,0x3d);
        std::__cxx11::string::substr((ulong)&local_e8,(ulong)p_Var1);
        std::__cxx11::string::_M_append((char *)&def,(ulong)local_e8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if (lVar6 != -1) {
          std::__cxx11::string::append((char *)&def);
          std::__cxx11::string::substr((ulong)&local_a0,(ulong)p_Var1);
          str._M_str = (char *)local_a0;
          str._M_len = local_98;
          cmOutputConverter::EscapeForShell_abi_cxx11_
                    (&local_e8,local_80,str,true,false,false,false,false);
          std::__cxx11::string::_M_append((char *)&def,(ulong)local_e8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          if (local_a0 != local_90) {
            operator_delete(local_a0,local_90[0] + 1);
          }
        }
      }
      psVar3 = local_78;
      std::__cxx11::string::append((char *)local_78);
      std::__cxx11::string::_M_append((char *)psVar3,(ulong)def._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)def._M_dataplus._M_p != &def.field_2) {
        operator_delete(def._M_dataplus._M_p,def.field_2._M_allocated_capacity + 1);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      pcVar10 = " ";
    } while (p_Var7 != local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dflag._M_dataplus._M_p != &dflag.field_2) {
    operator_delete(dflag._M_dataplus._M_p,dflag.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::JoinDefines(const std::set<std::string>& defines,
                                   std::string& definesString,
                                   const std::string& lang)
{
  // Lookup the define flag for the current language.
  std::string dflag = "-D";
  if (!lang.empty()) {
    cmValue df =
      this->Makefile->GetDefinition(cmStrCat("CMAKE_", lang, "_DEFINE_FLAG"));
    if (cmNonempty(df)) {
      dflag = *df;
    }
  }
  const char* itemSeparator = definesString.empty() ? "" : " ";
  for (std::string const& define : defines) {
    // Append the definition with proper escaping.
    std::string def = dflag;
    if (this->GetState()->UseWatcomWMake()) {
      // The Watcom compiler does its own command line parsing instead
      // of using the windows shell rules.  Definitions are one of
      //   -DNAME
      //   -DNAME=<cpp-token>
      //   -DNAME="c-string with spaces and other characters(?@#$)"
      //
      // Watcom will properly parse each of these cases from the
      // command line without any escapes.  However we still have to
      // get the '$' and '#' characters through WMake as '$$' and
      // '$#'.
      for (char c : define) {
        if (c == '$' || c == '#') {
          def += '$';
        }
        def += c;
      }
    } else {
      // Make the definition appear properly on the command line.  Use
      // -DNAME="value" instead of -D"NAME=value" for historical reasons.
      std::string::size_type eq = define.find('=');
      def += define.substr(0, eq);
      if (eq != std::string::npos) {
        def += "=";
        def += this->EscapeForShell(define.substr(eq + 1), true);
      }
    }
    definesString += itemSeparator;
    itemSeparator = " ";
    definesString += def;
  }
}